

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivfdec.c
# Opt level: O0

int file_is_ivf(AvxInputContext *input_ctx)

{
  uint uVar1;
  size_t sVar2;
  AvxInputContext *in_RDI;
  int is_ivf;
  uchar raw_hdr [32];
  int iVar3;
  int in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  size_t in_stack_ffffffffffffffe0;
  AvxInputContext *in_stack_ffffffffffffffe8;
  
  iVar3 = 0;
  sVar2 = buffer_input(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                       (uchar *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),false)
  ;
  if ((sVar2 == 0x20) && (*(int *)IVF_SIGNATURE == in_stack_ffffffffffffffd8)) {
    iVar3 = 1;
    uVar1 = mem_get_le16_as_int(&stack0xffffffffffffffdc);
    if (uVar1 != 0) {
      fprintf(_stderr,"Error: Unrecognized IVF version! This file may not decode properly.\n");
    }
    uVar1 = mem_get_le32_as_int(&stack0xffffffffffffffe0);
    in_RDI->fourcc = uVar1;
    uVar1 = mem_get_le16_as_int(&stack0xffffffffffffffe4);
    in_RDI->width = uVar1;
    uVar1 = mem_get_le16_as_int(&stack0xffffffffffffffe6);
    in_RDI->height = uVar1;
    uVar1 = mem_get_le32_as_int(&stack0xffffffffffffffe8);
    (in_RDI->framerate).numerator = uVar1;
    uVar1 = mem_get_le32_as_int(&stack0xffffffffffffffec);
    (in_RDI->framerate).denominator = uVar1;
    fix_framerate(&(in_RDI->framerate).numerator,&(in_RDI->framerate).denominator);
  }
  if (iVar3 == 0) {
    rewind_detect(in_RDI);
  }
  return iVar3;
}

Assistant:

int file_is_ivf(struct AvxInputContext *input_ctx) {
  unsigned char raw_hdr[32];
  int is_ivf = 0;

  if (buffer_input(input_ctx, 32, raw_hdr, /*buffered=*/true) == 32) {
    if (memcmp(IVF_SIGNATURE, raw_hdr, 4) == 0) {
      is_ivf = 1;

      if (mem_get_le16(raw_hdr + 4) != 0) {
        fprintf(stderr,
                "Error: Unrecognized IVF version! This file may not"
                " decode properly.\n");
      }

      input_ctx->fourcc = mem_get_le32(raw_hdr + 8);
      input_ctx->width = mem_get_le16(raw_hdr + 12);
      input_ctx->height = mem_get_le16(raw_hdr + 14);
      input_ctx->framerate.numerator = mem_get_le32(raw_hdr + 16);
      input_ctx->framerate.denominator = mem_get_le32(raw_hdr + 20);
      fix_framerate(&input_ctx->framerate.numerator,
                    &input_ctx->framerate.denominator);
    }
  }

  if (!is_ivf) {
    rewind_detect(input_ctx);
  }
  return is_ivf;
}